

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.cpp
# Opt level: O2

DEVICE_FEATURE_STATE
Diligent::GetFeatureState
          (DEVICE_FEATURE_STATE RequestedState,DEVICE_FEATURE_STATE SupportedState,char *FeatureName
          )

{
  int iVar1;
  undefined7 in_register_00000039;
  char *FeatureName_local;
  string msg;
  
  iVar1 = (int)CONCAT71(in_register_00000039,RequestedState);
  if (iVar1 != 2) {
    FeatureName_local = FeatureName;
    if (iVar1 != 1) {
      if (iVar1 == 0) {
        return SupportedState == DEVICE_FEATURE_STATE_ENABLED;
      }
      FormatString<char[25]>(&msg,(char (*) [25])"Unexpected feature state");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetFeatureState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
                 ,0x38);
      std::__cxx11::string::~string((string *)&msg);
      return DEVICE_FEATURE_STATE_DISABLED;
    }
    if (SupportedState != DEVICE_FEATURE_STATE_DISABLED) {
      return DEVICE_FEATURE_STATE_ENABLED;
    }
    LogError<true,char_const*,char[30]>
              (false,"GetFeatureState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
               ,0x2f,&FeatureName_local,(char (*) [30])0x6feaef);
  }
  return SupportedState != DEVICE_FEATURE_STATE_DISABLED;
}

Assistant:

static DEVICE_FEATURE_STATE GetFeatureState(DEVICE_FEATURE_STATE RequestedState, DEVICE_FEATURE_STATE SupportedState, const char* FeatureName) noexcept(false)
{
    switch (RequestedState)
    {
        case DEVICE_FEATURE_STATE_DISABLED:
            return SupportedState == DEVICE_FEATURE_STATE_ENABLED ?
                DEVICE_FEATURE_STATE_ENABLED : // the feature is supported by default and can not be disabled
                DEVICE_FEATURE_STATE_DISABLED;

        case DEVICE_FEATURE_STATE_ENABLED:
        {
            if (SupportedState != DEVICE_FEATURE_STATE_DISABLED)
                return DEVICE_FEATURE_STATE_ENABLED;
            else
                LOG_ERROR_AND_THROW(FeatureName, " not supported by this device");
        }

        case DEVICE_FEATURE_STATE_OPTIONAL:
            return SupportedState != DEVICE_FEATURE_STATE_DISABLED ?
                DEVICE_FEATURE_STATE_ENABLED :
                DEVICE_FEATURE_STATE_DISABLED;

        default:
            UNEXPECTED("Unexpected feature state");
            return DEVICE_FEATURE_STATE_DISABLED;
    }
}